

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_std::atomic<unsigned_int>_&,_const_unsigned_int_&>::
streamReconstructedExpression
          (BinaryExpr<const_std::atomic<unsigned_int>_&,_const_unsigned_int_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  atomic<unsigned_int> *in_RDX;
  string *in_R9;
  StringRef op;
  string local_60;
  type local_40;
  
  StringMaker<std::atomic<unsigned_int>,void>::convert<std::atomic<unsigned_int>>
            (&local_40,(StringMaker<std::atomic<unsigned_int>,void> *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::stringify<unsigned_int>(&local_60,this->m_rhs);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }